

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O0

void __thiscall pool_display::test_method(pool_display *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  Entity *pEVar5;
  lazy_ostream *plVar6;
  long *plVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
  *this_00;
  ostream *poVar8;
  streambuf *psVar9;
  void *this_01;
  istringstream *piVar10;
  string *psVar11;
  allocator<char> local_fe9;
  string local_fe8 [8];
  string name_entity;
  basic_cstring<const_char> local_fb8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_fa8;
  assertion_result local_f88;
  basic_cstring<const_char> local_f70;
  basic_cstring<const_char> local_f60;
  allocator<char> local_f49;
  string local_f48 [32];
  basic_cstring<const_char> local_f28;
  basic_cstring<const_char> local_f18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f08;
  assertion_result local_ee8;
  basic_cstring<const_char> local_ed0;
  basic_cstring<const_char> local_ec0;
  ExceptionFactory *aef_3;
  string local_ea0 [32];
  basic_cstring<const_char> local_e80;
  basic_cstring<const_char> local_e70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e60;
  assertion_result local_e40;
  basic_cstring<const_char> local_e28;
  basic_cstring<const_char> local_e18;
  undefined1 local_e08 [8];
  string aSignalName;
  SignalBase<int> *aSignal;
  string local_dd8 [32];
  istringstream local_db8 [8];
  istringstream an_iss;
  basic_cstring<const_char> local_c38;
  basic_cstring<const_char> local_c28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c18;
  assertion_result local_bf8;
  basic_cstring<const_char> local_be0;
  basic_cstring<const_char> local_bd0;
  byte local_bb9;
  undefined1 local_bb8 [7];
  bool two_sub_string_identical;
  string sub_str_to_test;
  size_t find_str_to_test;
  string sub_s_output_wgph;
  size_t find_s_output_wgph;
  string local_b60 [8];
  string s_crmk;
  string s_output_wgph;
  string local_b18 [8];
  string str_to_test;
  ostringstream oss_output_wgph;
  char local_980 [8];
  fstream the_debug_file;
  allocator<char> local_769;
  string local_768 [32];
  basic_cstring<const_char> local_748;
  basic_cstring<const_char> local_738;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_728;
  basic_cstring<const_char> local_708;
  assertion_result local_6f8;
  basic_cstring<const_char> local_6e0;
  basic_cstring<const_char> local_6d0;
  basic_cstring<const_char> local_6c0;
  basic_cstring<const_char> local_6b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6a0;
  assertion_result local_680;
  basic_cstring<const_char> local_668;
  basic_cstring<const_char> local_658;
  allocator<char> local_641;
  string local_640 [32];
  basic_cstring<const_char> local_620;
  basic_cstring<const_char> local_610;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_600;
  assertion_result local_5e0;
  basic_cstring<const_char> local_5c8;
  basic_cstring<const_char> local_5b8;
  _Self local_5a8;
  allocator<char> local_599;
  key_type local_598;
  _Self local_578;
  byte local_569;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
  *pmStack_568;
  bool testExistence;
  Entities *anEntityMap;
  basic_cstring<const_char> local_550;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_540;
  assertion_result local_520;
  basic_cstring<const_char> local_508;
  basic_cstring<const_char> local_4f8;
  ExceptionFactory *aef_2;
  string local_4d8 [32];
  basic_cstring<const_char> local_4b8;
  basic_cstring<const_char> local_4a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_498;
  basic_cstring<const_char> local_478;
  assertion_result local_468;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  allocator<char> local_429;
  string local_428 [32];
  long *local_408;
  Entity *e;
  output_test_stream local_3f0 [8];
  output_test_stream output;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_250;
  assertion_result local_230;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  ExceptionFactory *aef_1;
  string local_1e8 [32];
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a8;
  assertion_result local_188;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  ExceptionFactory *aef;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_128;
  assertion_result local_108;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  byte local_ca;
  allocator<char> local_c9;
  string local_c8 [6];
  bool res2;
  allocator<char> local_a1;
  string local_a0 [32];
  Entity *local_80;
  Entity *entity2;
  string local_70 [6];
  bool res;
  allocator<char> local_39;
  string local_38 [32];
  Entity *local_18;
  Entity *entity;
  pool_display *this_local;
  
  entity = (Entity *)this;
  psVar4 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"MyEntity",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"MyEntityInst",(allocator<char> *)((long)&entity2 + 7));
  pEVar5 = (Entity *)dynamicgraph::FactoryStorage::newEntity(psVar4,local_38);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&entity2 + 7));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  entity2._6_1_ = 0;
  local_18 = pEVar5;
  psVar4 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"MyEntity",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"MyEntityInst",&local_c9);
  pEVar5 = (Entity *)dynamicgraph::FactoryStorage::newEntity(psVar4,local_a0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_ca = pEVar5 == local_18;
  local_80 = pEVar5;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x44,&local_f0);
    boost::test_tools::assertion_result::assertion_result(&local_108,(bool)(local_ca & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_138,"res2",4);
    boost::unit_test::operator<<(&local_128,plVar6,&local_138);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&aef,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_108,&local_128,&aef,0x44,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_128);
    boost::test_tools::assertion_result::~assertion_result(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_170);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_160,0x48,&local_170);
    boost::test_tools::assertion_result::assertion_result(&local_188,(bool)(entity2._6_1_ & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_1b8,"res",3);
    boost::unit_test::operator<<(&local_1a8,plVar6,&local_1b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_188,&local_1a8,&local_1c8,0x48,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1a8);
    boost::test_tools::assertion_result::~assertion_result(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  entity2._6_1_ = 0;
  psVar4 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"MyEntityInstFailure",(allocator<char> *)((long)&aef_1 + 7));
  dynamicgraph::FactoryStorage::deregisterEntity(psVar4);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aef_1 + 7));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_218);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_208,0x51,&local_218);
    boost::test_tools::assertion_result::assertion_result(&local_230,(bool)(entity2._6_1_ & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_260,"res",3);
    boost::unit_test::operator<<(&local_250,plVar6,&local_260);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_230,&local_250,&local_270,0x51,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_250);
    boost::test_tools::assertion_result::~assertion_result(&local_230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)&e);
  boost::test_tools::output_test_stream::output_test_stream
            (local_3f0,(basic_cstring<const_char> *)&e,1);
  psVar4 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_428,"MyEntityInst",&local_429);
  plVar7 = (long *)dynamicgraph::PoolStorage::getEntity(psVar4);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  local_408 = plVar7;
  (**(code **)(*plVar7 + 0x30))(plVar7,local_3f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_450);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x57,&local_450);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_478,"Hello! My name is MyEntityInst !\n");
    boost::test_tools::output_test_stream::is_equal(&local_468,local_3f0,&local_478,1);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a8,"output.is_equal(\"Hello! My name is MyEntityInst !\\n\")",0x35);
    boost::unit_test::operator<<(&local_498,plVar6,&local_4a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_468,&local_498,&local_4b8,0x57,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_498);
    boost::test_tools::assertion_result::~assertion_result(&local_468);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  entity2._6_1_ = 0;
  psVar4 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"MyEntityInstFailure",(allocator<char> *)((long)&aef_2 + 7));
  dynamicgraph::PoolStorage::getEntity(psVar4);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aef_2 + 7));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_508);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4f8,0x60,&local_508);
    boost::test_tools::assertion_result::assertion_result(&local_520,(bool)(entity2._6_1_ & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_550,"res",3);
    boost::unit_test::operator<<(&local_540,plVar6,&local_550);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&anEntityMap,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_520,&local_540,&anEntityMap,0x60,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_540);
    boost::test_tools::assertion_result::~assertion_result(&local_520);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  dynamicgraph::PoolStorage::getInstance();
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
             *)dynamicgraph::PoolStorage::getEntityMap_abi_cxx11_();
  pmStack_568 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"MyEntityInst",&local_599)
  ;
  local_578._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
       ::find(this_00,&local_598);
  local_5a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
       ::end(pmStack_568);
  bVar2 = std::operator==(&local_578,&local_5a8);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  local_569 = bVar2;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5b8,0x67,&local_5c8);
    boost::test_tools::assertion_result::assertion_result(&local_5e0,(bool)(~local_569 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_610,"!testExistence",0xe);
    boost::unit_test::operator<<(&local_600,plVar6,&local_610);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_5e0,&local_600,&local_620,0x67,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_600);
    boost::test_tools::assertion_result::~assertion_result(&local_5e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar4 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_640,"MyEntityInst",&local_641);
  local_569 = dynamicgraph::PoolStorage::existEntity(psVar4,(Entity **)local_640);
  local_569 = local_569 & 1;
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_668);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_658,0x6d,&local_668);
    boost::test_tools::assertion_result::assertion_result(&local_680,(bool)(local_569 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b0,"testExistence",0xd);
    boost::unit_test::operator<<(&local_6a0,plVar6,&local_6b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6c0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_680,&local_6a0,&local_6c0,0x6d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6a0);
    boost::test_tools::assertion_result::~assertion_result(&local_680);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar8 = (ostream *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::writeCompletionList(poVar8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6d0,0x73,&local_6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_708,
               "MyEntityInst.in_double\nMyEntityInst.out_double\nprint\nsignals\nsignalDep\n");
    boost::test_tools::output_test_stream::is_equal(&local_6f8,local_3f0,&local_708,1);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_738,
               "output.is_equal(\"MyEntityInst.in_double\\nMyEntityInst.out_double\\n\" \"print\\nsignals\\nsignalDep\\n\")"
               ,0x62);
    boost::unit_test::operator<<(&local_728,plVar6,&local_738);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_748,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_6f8,&local_728,&local_748,0x73,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_728);
    boost::test_tools::assertion_result::~assertion_result(&local_6f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar4 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_768,"output.dot",&local_769);
  dynamicgraph::PoolStorage::writeGraph(psVar4);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator(&local_769);
  std::fstream::fstream(local_980);
  std::operator|(_S_in,_S_out);
  std::fstream::open(local_980,0x14b513);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(str_to_test.field_2._M_local_buf + 8));
  psVar9 = (streambuf *)std::fstream::rdbuf();
  std::ostream::operator<<((void *)((long)&str_to_test.field_2 + 8),psVar9);
  std::fstream::close();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b18,
             "/* This graph has been automatically generated.\n   2019 Month: 2 Day: 28 Time: 11:28 */\ndigraph \"output\" { \t graph [ label=\"output\" bgcolor = white rankdir=LR ]\n\t node [ fontcolor = black, color = black,fillcolor = gold1, style=filled, shape=box ] ; \n\tsubgraph cluster_Entities { \n\t} \n\"MyEntityInst\" [ label = \"MyEntityInst\" ,\n   fontcolor = black, color = black, fillcolor=cyan, style=filled, shape=box ]\n}\n"
             ,(allocator<char> *)(s_output_wgph.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s_output_wgph.field_2._M_local_buf + 0xf));
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b60,"*/",(allocator<char> *)((long)&find_s_output_wgph + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&find_s_output_wgph + 7));
  sub_s_output_wgph.field_2._8_8_ =
       std::__cxx11::string::find((string *)(s_crmk.field_2._M_local_buf + 8),(ulong)local_b60);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&find_str_to_test,(ulong)(s_crmk.field_2._M_local_buf + 8));
  sub_str_to_test.field_2._8_8_ = std::__cxx11::string::find(local_b18,(ulong)local_b60);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_bb8,(ulong)local_b18);
  local_bb9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_bb8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &find_str_to_test);
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_bb8);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)&find_str_to_test);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  iVar3 = std::__cxx11::string::compare((string *)local_bb8);
  this_01 = (void *)std::ostream::operator<<(&std::cout,iVar3);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bd0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_be0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bd0,0x9c,&local_be0);
    boost::test_tools::assertion_result::assertion_result(&local_bf8,(bool)(local_bb9 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c28,"two_sub_string_identical",0x18);
    boost::unit_test::operator<<(&local_c18,plVar6,&local_c28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c38,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_bf8,&local_c18,&local_c38,0x9c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c18);
    boost::test_tools::assertion_result::~assertion_result(&local_bf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_dd8,"MyEntityInst.in_double",(allocator<char> *)((long)&aSignal + 7));
  std::__cxx11::istringstream::istringstream(local_db8,local_dd8,_S_in);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aSignal + 7));
  piVar10 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  aSignalName.field_2._8_8_ = dynamicgraph::PoolStorage::getSignal(piVar10);
  psVar11 = dynamicgraph::SignalBase<int>::getName_abi_cxx11_
                      ((SignalBase<int> *)aSignalName.field_2._8_8_);
  std::__cxx11::string::string((string *)local_e08,(string *)psVar11);
  local_569 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e08,"MyEntity(MyEntityInst)::input(double)::in_double");
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e18,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e28);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e18,0xa7,&local_e28);
    boost::test_tools::assertion_result::assertion_result(&local_e40,(bool)(local_569 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e70,"testExistence",0xd);
    boost::unit_test::operator<<(&local_e60,plVar6,&local_e70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e80,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_e40,&local_e60,&local_e80,0xa7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e60);
    boost::test_tools::assertion_result::~assertion_result(&local_e40);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ea0,"MyEntityInst.in2double",(allocator<char> *)((long)&aef_3 + 7));
  std::__cxx11::istringstream::str((string *)local_db8);
  std::__cxx11::string::~string(local_ea0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aef_3 + 7));
  piVar10 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::getSignal(piVar10);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ec0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ed0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ec0,0xb1,&local_ed0);
    boost::test_tools::assertion_result::assertion_result(&local_ee8,(bool)(entity2._6_1_ & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_f18,"res",3);
    boost::unit_test::operator<<(&local_f08,plVar6,&local_f18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f28,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion(&local_ee8,&local_f08,&local_f28,0xb1,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f08);
    boost::test_tools::assertion_result::~assertion_result(&local_ee8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar4 = (string *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::Entity::getName_abi_cxx11_(local_18);
  dynamicgraph::PoolStorage::deregisterEntity(psVar4);
  psVar4 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f48,"MyEntityInst",&local_f49);
  local_569 = dynamicgraph::PoolStorage::existEntity(psVar4,(Entity **)local_f48);
  local_569 = local_569 & 1;
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator(&local_f49);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f60,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f60,0xba,&local_f70);
    boost::test_tools::assertion_result::assertion_result(&local_f88,(bool)(~local_569 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fb8,"!testExistence",0xe);
    boost::unit_test::operator<<(&local_fa8,plVar6,&local_fb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&name_entity.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp"
               ,0x5f);
    boost::test_tools::tt_detail::report_assertion
              (&local_f88,&local_fa8,(undefined1 *)((long)&name_entity.field_2 + 8),0xba,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_fa8);
    boost::test_tools::assertion_result::~assertion_result(&local_f88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fe8,"MyEntityInst2",&local_fe9);
  std::allocator<char>::~allocator(&local_fe9);
  psVar4 = (string *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::clearPlugin(psVar4);
  dynamicgraph::PoolStorage::destroy();
  std::__cxx11::string::~string(local_fe8);
  std::__cxx11::string::~string((string *)local_e08);
  std::__cxx11::istringstream::~istringstream(local_db8);
  std::__cxx11::string::~string((string *)local_bb8);
  std::__cxx11::string::~string((string *)&find_str_to_test);
  std::__cxx11::string::~string(local_b60);
  std::__cxx11::string::~string((string *)(s_crmk.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_b18);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(str_to_test.field_2._M_local_buf + 8));
  std::fstream::~fstream(local_980);
  boost::test_tools::output_test_stream::~output_test_stream(local_3f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(pool_display) {
  /// Create Entity
  dg::Entity *entity =
      dg::FactoryStorage::getInstance()->newEntity("MyEntity", "MyEntityInst");

  /// Test exception catching when registering Entity
  bool res = false;
  try {
    dg::Entity *entity2 = dg::FactoryStorage::getInstance()->newEntity(
        "MyEntity", "MyEntityInst");

    bool res2 = (entity2 == entity);
    BOOST_CHECK(res2);
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::OBJECT_CONFLICT);
  }
  BOOST_CHECK(res);

  /// Test exception catching when deregistering Entity
  res = false;
  try {
    dg::FactoryStorage::getInstance()->deregisterEntity("MyEntityInstFailure");
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::OBJECT_CONFLICT);
  }
  BOOST_CHECK(res);

  /// Search for an entity inside the map
  output_test_stream output;
  dg::Entity &e = dg::PoolStorage::getInstance()->getEntity("MyEntityInst");
  e.display(output);
  BOOST_CHECK(output.is_equal("Hello! My name is MyEntityInst !\n"));

  /// Search for an entity inside the map
  res = false;
  try {
    dg::PoolStorage::getInstance()->getEntity("MyEntityInstFailure");
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::UNREFERED_OBJECT);
  }
  BOOST_CHECK(res);

  /// Testing entityMap
  const dg::PoolStorage::Entities &anEntityMap =
      dg::PoolStorage::getInstance()->getEntityMap();

  bool testExistence = anEntityMap.find("MyEntityInst") == anEntityMap.end();
  BOOST_CHECK(!testExistence);

  /// Testing the existence of an entity
  testExistence =
      dg::PoolStorage::getInstance()->existEntity("MyEntityInst", entity);

  BOOST_CHECK(testExistence);

  /// Testing the completion list of pool storage
  dg::PoolStorage::getInstance()->writeCompletionList(output);
  BOOST_CHECK(
      output.is_equal("MyEntityInst.in_double\nMyEntityInst.out_double\n"
                      "print\nsignals\nsignalDep\n"));

  /// Checking the graph generated by the pool
  dg::PoolStorage::getInstance()->writeGraph("output.dot");
  std::fstream the_debug_file;
  the_debug_file.open("output.dot");
  std::ostringstream oss_output_wgph;
  oss_output_wgph << the_debug_file.rdbuf();
  the_debug_file.close();

  /// Use a predefined output
  std::string str_to_test =
      "/* This graph has been automatically generated.\n"
      "   2019 Month: 2 Day: 28 Time: 11:28 */\n"
      "digraph \"output\" { \t graph [ label=\"output\" "
      "bgcolor = white rankdir=LR ]\n"
      "\t node [ fontcolor = black, color = black,fillcolor = gold1,"
      " style=filled, shape=box ] ; \n"
      "\tsubgraph cluster_Entities { \n"
      "\t} \n"
      "\"MyEntityInst\" [ label = \"MyEntityInst\" ,\n"
      "   fontcolor = black, color = black, fillcolor=cyan, style=filled,"
      " shape=box ]\n"
      "}\n";

  /// Check the two substring (remove the date) -
  std::string s_output_wgph = oss_output_wgph.str();
  std::string s_crmk = "*/";

  std::size_t find_s_output_wgph = s_output_wgph.find(s_crmk);
  std::string sub_s_output_wgph =
      s_output_wgph.substr(find_s_output_wgph, s_output_wgph.length());
  std::size_t find_str_to_test = str_to_test.find(s_crmk);
  std::string sub_str_to_test =
      str_to_test.substr(find_str_to_test, str_to_test.length());

  bool two_sub_string_identical;
  two_sub_string_identical = sub_str_to_test == sub_s_output_wgph;
  std::cout << sub_str_to_test << std::endl;
  std::cout << sub_s_output_wgph << std::endl;
  std::cout << sub_str_to_test.compare(sub_s_output_wgph) << std::endl;
  BOOST_CHECK(two_sub_string_identical);

  /// Test name of a valid signal.
  std::istringstream an_iss("MyEntityInst.in_double");

  dg::SignalBase<int> &aSignal =
      dg::PoolStorage::getInstance()->getSignal(an_iss);

  std::string aSignalName = aSignal.getName();
  testExistence =
      aSignalName == "MyEntity(MyEntityInst)::input(double)::in_double";
  BOOST_CHECK(testExistence);

  /// Test name of an unvalid signal.
  an_iss.str("MyEntityInst.in2double");

  try {
    dg::PoolStorage::getInstance()->getSignal(an_iss);
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::UNREFERED_SIGNAL);
  }
  BOOST_CHECK(res);

  /// Deregister the entity.
  dg::PoolStorage::getInstance()->deregisterEntity(entity->getName());

  /// Testing the existance of an entity
  testExistence =
      dg::PoolStorage::getInstance()->existEntity("MyEntityInst", entity);

  BOOST_CHECK(!testExistence);

  /// Create Entity
  std::string name_entity("MyEntityInst2");
  dg::PoolStorage::getInstance()->clearPlugin(name_entity);

  dg::PoolStorage::destroy();
}